

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool trans_CTERM(DisasContext_conflict1 *s,arg_CTERM *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  TCGCond cond_00;
  TCGv_i64 arg1;
  TCGv_i64 arg2;
  TCGv_i64 ret;
  TCGv_i64 cmp;
  TCGv_i64 rm;
  TCGv_i64 rn;
  TCGCond cond;
  TCGContext_conflict1 *tcg_ctx;
  arg_CTERM *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (_Var1) {
    cond_00 = TCG_COND_EQ;
    if (a->ne != 0) {
      cond_00 = TCG_COND_NE;
    }
    arg1 = read_cpu_reg_aarch64(s,a->rn,a->sf);
    arg2 = read_cpu_reg_aarch64(s,a->rm,a->sf);
    ret = tcg_temp_new_i64(tcg_ctx_00);
    tcg_gen_setcond_i64_aarch64(tcg_ctx_00,cond_00,ret,arg1,arg2);
    tcg_gen_extrl_i64_i32_aarch64(tcg_ctx_00,tcg_ctx_00->cpu_NF,ret);
    tcg_temp_free_i64(tcg_ctx_00,ret);
    tcg_gen_xori_i32_aarch64(tcg_ctx_00,tcg_ctx_00->cpu_VF,tcg_ctx_00->cpu_NF,1);
    tcg_gen_andc_i32_aarch64(tcg_ctx_00,tcg_ctx_00->cpu_VF,tcg_ctx_00->cpu_VF,tcg_ctx_00->cpu_CF);
    tcg_gen_neg_i32(tcg_ctx_00,tcg_ctx_00->cpu_NF,tcg_ctx_00->cpu_NF);
    tcg_gen_neg_i32(tcg_ctx_00,tcg_ctx_00->cpu_VF,tcg_ctx_00->cpu_VF);
  }
  return true;
}

Assistant:

static bool trans_CTERM(DisasContext *s, arg_CTERM *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (!sve_access_check(s)) {
        return true;
    }

    TCGCond cond = (a->ne ? TCG_COND_NE : TCG_COND_EQ);
    TCGv_i64 rn = read_cpu_reg(s, a->rn, a->sf);
    TCGv_i64 rm = read_cpu_reg(s, a->rm, a->sf);
    TCGv_i64 cmp = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_setcond_i64(tcg_ctx, cond, cmp, rn, rm);
    tcg_gen_extrl_i64_i32(tcg_ctx, tcg_ctx->cpu_NF, cmp);
    tcg_temp_free_i64(tcg_ctx, cmp);

    /* VF = !NF & !CF.  */
    tcg_gen_xori_i32(tcg_ctx, tcg_ctx->cpu_VF, tcg_ctx->cpu_NF, 1);
    tcg_gen_andc_i32(tcg_ctx, tcg_ctx->cpu_VF, tcg_ctx->cpu_VF, tcg_ctx->cpu_CF);

    /* Both NF and VF actually look at bit 31.  */
    tcg_gen_neg_i32(tcg_ctx, tcg_ctx->cpu_NF, tcg_ctx->cpu_NF);
    tcg_gen_neg_i32(tcg_ctx, tcg_ctx->cpu_VF, tcg_ctx->cpu_VF);
    return true;
}